

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

int32_t ggml_get_i32_1d(ggml_tensor *tensor,int i)

{
  int in_ESI;
  undefined4 *in_RDI;
  float fVar1;
  int local_4;
  
  switch(*in_RDI) {
  case 0:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb0a,
            "false");
    abort();
  case 1:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb0e,
            "false");
    abort();
  case 2:
    if (*(long *)(in_RDI + 6) != 1) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb12
              ,"tensor->nb[0] == sizeof(int8_t)");
      abort();
    }
    local_4 = (int)*(char *)(*(long *)(in_RDI + 0x24) + (long)in_ESI);
    break;
  case 3:
    if (*(long *)(in_RDI + 6) != 2) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb17
              ,"tensor->nb[0] == sizeof(int16_t)");
      abort();
    }
    local_4 = (int)*(short *)(*(long *)(in_RDI + 0x24) + (long)in_ESI * 2);
    break;
  case 4:
    if (*(long *)(in_RDI + 6) != 4) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb1c
              ,"tensor->nb[0] == sizeof(int32_t)");
      abort();
    }
    local_4 = *(int *)(*(long *)(in_RDI + 0x24) + (long)in_ESI * 4);
    break;
  case 5:
    if (*(long *)(in_RDI + 6) != 2) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb21
              ,"tensor->nb[0] == sizeof(ggml_fp16_t)");
      abort();
    }
    fVar1 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(*(long *)(in_RDI + 0x24) + (long)in_ESI * 2));
    local_4 = (int)fVar1;
    break;
  case 6:
    if (*(long *)(in_RDI + 6) != 4) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb26
              ,"tensor->nb[0] == sizeof(float)");
      abort();
    }
    local_4 = (int)*(float *)(*(long *)(in_RDI + 0x24) + (long)in_ESI * 4);
    break;
  case 7:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb2b,
            "false");
    abort();
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int32_t ggml_get_i32_1d(const struct ggml_tensor * tensor, int i) {
    switch (tensor->type) {
        case GGML_TYPE_Q4_0:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_Q4_1:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_I8:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int8_t));
                return ((int8_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_I16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int16_t));
                return ((int16_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_I32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int32_t));
                return ((int32_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_F16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_fp16_t));
                return GGML_FP16_TO_FP32(((ggml_fp16_t *)(tensor->data))[i]);
            } break;
        case GGML_TYPE_F32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(float));
                return ((float *)(tensor->data))[i];
            } break;
        case GGML_TYPE_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }

    return 0.0f;
}